

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>::
insert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,capnp::Text::Reader&>
          (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> table,size_t pos,
          Reader *params)

{
  bool bVar1;
  size_t index;
  Entry *e;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  Entry *this_00;
  Reader *in_R9;
  Maybe<unsigned_long> MVar3;
  size_t local_78;
  SearchKeyImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:1530:22)>
  local_70;
  undefined1 local_50 [8];
  Iterator iter;
  Reader *params_local;
  size_t pos_local;
  TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks> *this_local;
  ArrayPtr<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> table_local;
  
  this_local = (TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks> *)table.size_;
  this_00 = table.ptr;
  iter._16_8_ = in_R9;
  table_local.ptr = (Entry *)pos;
  table_local.size_ = (size_t)this;
  searchKey<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,capnp::Text::Reader>
            (&local_70,
             (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks> *)this_00,
             (ArrayPtr<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *)&this_local,in_R9);
  kj::_::BTreeImpl::insert
            ((Iterator *)local_50,(BTreeImpl *)&(this_00->key).super_StringPtr.content.size_,
             &local_70.super_SearchKey);
  bVar1 = kj::_::BTreeImpl::Iterator::isEnd((Iterator *)local_50);
  if (!bVar1) {
    index = kj::_::BTreeImpl::Iterator::operator*((Iterator *)local_50);
    e = ArrayPtr<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>::operator[]
                  ((ArrayPtr<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *)&this_local,
                   index);
    bVar1 = TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks::matches<capnp::Text::Reader&>
                      ((Callbacks *)this_00,e,(Reader *)iter._16_8_);
    if (bVar1) {
      local_78 = kj::_::BTreeImpl::Iterator::operator*((Iterator *)local_50);
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_78);
      aVar2 = extraout_RDX;
      goto LAB_0023509c;
    }
  }
  kj::_::BTreeImpl::Iterator::insert
            ((Iterator *)local_50,(BTreeImpl *)&(this_00->key).super_StringPtr.content.size_,
             (uint)params);
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
  aVar2 = extraout_RDX_00;
LAB_0023509c:
  MVar3.ptr.field_1.value = aVar2.value;
  MVar3.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }